

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

GCstr * argv2str(jit_State *J,TValue *o)

{
  GCstr *pGVar1;
  ulong uVar2;
  
  uVar2 = o->it64 >> 0x2f;
  if (uVar2 == 0xfffffffffffffffb) {
    pGVar1 = (GCstr *)(o->it64 & 0x7fffffffffff);
  }
  else {
    if (0xfffffffffffffff2 < uVar2) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    pGVar1 = lj_strfmt_number(J->L,o);
    o->u64 = (ulong)pGVar1 | 0xfffd800000000000;
  }
  return pGVar1;
}

Assistant:

static GCstr *argv2str(jit_State *J, TValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    return strV(o);
  } else {
    GCstr *s;
    if (!tvisnumber(o))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    s = lj_strfmt_number(J->L, o);
    setstrV(J->L, o, s);
    return s;
  }
}